

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O2

void __thiscall NaNNRegrPlantLearn::~NaNNRegrPlantLearn(NaNNRegrPlantLearn *this)

{
  this->_vptr_NaNNRegrPlantLearn = (_func_int **)&PTR__NaNNRegrPlantLearn_00107c58;
  NaPNSkip::~NaPNSkip(&this->skip_yt);
  NaPNSkip::~NaPNSkip(&this->skip_u);
  NaPNSkip::~NaPNSkip(&this->skip_y);
  NaPNDelay::~NaPNDelay(&this->delay_yt);
  NaPNDelay::~NaPNDelay(&this->delay_u);
  NaPNDelay::~NaPNDelay(&this->delay_y);
  NaPNStatistics::~NaPNStatistics(&this->statan_y);
  NaPNStatistics::~NaPNStatistics(&this->statan);
  NaPNComparator::~NaPNComparator(&this->errcomp);
  NaPNBus2i1o::~NaPNBus2i1o(&this->bus);
  NaPNTeacher::~NaPNTeacher(&this->nnteacher);
  NaPNNNUnit::~NaPNNNUnit(&this->nnplant);
  NaPNFileOutput::~NaPNFileOutput(&this->nn_y);
  NaPNFileOutput::~NaPNFileOutput(&this->tr_y);
  NaPNFetcher::~NaPNFetcher(&this->fetch_y);
  NaPNFileInput::~NaPNFileInput(&this->in_u);
  NaPNFileInput::~NaPNFileInput(&this->in_y);
  NaPetriNet::~NaPetriNet(&this->net);
  return;
}

Assistant:

NaNNRegrPlantLearn::~NaNNRegrPlantLearn ()
{
    // Nothing to do
}